

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_tpi(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *local_18;
  TCGv_i64 local_10;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = o->addr1 + (long)tcg_ctx;
  tcg_gen_callN_s390x(tcg_ctx,helper_tpi,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),2,&local_18);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_tpi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_tpi(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, o->addr1);
    set_cc_static(s);
    return DISAS_NEXT;
}